

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftpproto.c
# Opt level: O2

void do_type(session_t *sess)

{
  char *text;
  
  if (sess->cmd_arg[0] == 'I') {
    if (sess->cmd_arg[1] != '\0') goto LAB_0010472d;
    sess->is_ascii = 0;
    text = "Switch to Binary mode";
  }
  else {
    if ((sess->cmd_arg[0] != 'A') || (sess->cmd_arg[1] != '\0')) {
LAB_0010472d:
      ftp_relply(sess,500,"Unrecognised command.");
      return;
    }
    sess->is_ascii = 1;
    text = "Switch to ASCII mode";
  }
  ftp_relply(sess,200,text);
  return;
}

Assistant:

void do_type(session_t *sess) {
  if (strcmp(sess->cmd_arg, "A") == 0) {
    sess->is_ascii = 1;
    ftp_relply(sess, FTP_TYPEOK, "Switch to ASCII mode");
  } else if (strcmp(sess->cmd_arg, "I") == 0) {
    sess->is_ascii = 0;
    ftp_relply(sess, FTP_TYPEOK, "Switch to Binary mode");
  } else {
    ftp_relply(sess, FTP_BADCMD, "Unrecognised command.");
  }
}